

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw0_subh1_w16_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m128i *round_offset,int shift)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint in_ESI;
  __m128i *in_RDI;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 uVar21;
  undefined1 auVar6 [16];
  undefined1 auVar22 [16];
  long in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i m1;
  __m128i m0;
  __m128i m_ac;
  __m128i m_i10;
  __m128i m_i00;
  int j;
  int i;
  __m128i zeros;
  __m128i v_maxval;
  __m128i *in_stack_000002d0;
  int in_stack_000002d8;
  int local_100;
  int local_fc;
  __m128i *m1_00;
  __m128i *m0_00;
  CONV_BUF_TYPE *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined2 uVar23;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  
  uVar23 = 0x40;
  m1_00 = (__m128i *)0x0;
  m0_00 = (__m128i *)0x0;
  for (local_fc = 0; local_fc < in_stack_00000018; local_fc = local_fc + 1) {
    for (local_100 = 0; local_100 < (int)m1[0]; local_100 = local_100 + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + local_100));
      xx_loadu_128((void *)(in_stack_00000008 + (ulong)in_stack_00000010 + (long)local_100));
      auVar3._8_8_ = extraout_XMM0_Qb;
      auVar3._0_8_ = extraout_XMM0_Qa;
      auVar2._8_8_ = extraout_XMM0_Qb_00;
      auVar2._0_8_ = extraout_XMM0_Qa_00;
      auVar22 = paddusb(auVar3,auVar2);
      local_78 = auVar22[0];
      uStack_77 = auVar22[1];
      uStack_76 = auVar22[2];
      uStack_75 = auVar22[3];
      uStack_74 = auVar22[4];
      uStack_73 = auVar22[5];
      uStack_72 = auVar22[6];
      uStack_71 = auVar22[7];
      uStack_70 = auVar22[8];
      uStack_6f = auVar22[9];
      uStack_6e = auVar22[10];
      uStack_6d = auVar22[0xb];
      uStack_6c = auVar22[0xc];
      uStack_6b = auVar22[0xd];
      uStack_6a = auVar22[0xe];
      uStack_69 = auVar22[0xf];
      uVar5 = pavgb(local_78,0);
      uVar7 = pavgb(uStack_77,0);
      uVar8 = pavgb(uStack_76,0);
      uVar9 = pavgb(uStack_75,0);
      uVar10 = pavgb(uStack_74,0);
      uVar11 = pavgb(uStack_73,0);
      uVar12 = pavgb(uStack_72,0);
      uVar13 = pavgb(uStack_71,0);
      uVar14 = pavgb(uStack_70,0);
      uVar15 = pavgb(uStack_6f,0);
      uVar16 = pavgb(uStack_6e,0);
      uVar17 = pavgb(uStack_6d,0);
      uVar18 = pavgb(uStack_6c,0);
      uVar19 = pavgb(uStack_6b,0);
      uVar20 = pavgb(uStack_6a,0);
      uVar21 = pavgb(uStack_69,0);
      uVar1 = CONCAT17(uVar13,CONCAT16(uVar12,CONCAT15(uVar11,CONCAT14(uVar10,CONCAT13(uVar9,
                                                  CONCAT12(uVar8,CONCAT11(uVar7,uVar5)))))));
      auVar22[8] = uVar14;
      auVar22._0_8_ = uVar1;
      auVar22[9] = uVar15;
      auVar22[10] = uVar16;
      auVar22[0xb] = uVar17;
      auVar22[0xc] = uVar18;
      auVar22[0xd] = uVar19;
      auVar22[0xe] = uVar20;
      auVar22[0xf] = uVar21;
      pmovzxbw(auVar22,uVar1);
      uVar4 = CONCAT17(uVar21,CONCAT16(uVar20,CONCAT15(uVar19,CONCAT14(uVar18,CONCAT13(uVar17,
                                                  CONCAT12(uVar16,CONCAT11(uVar15,uVar14)))))));
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar4;
      pmovzxbw(auVar6,uVar4);
      blend_a64_d16_mask_w16_sse41
                ((uint8_t *)0x0,(CONV_BUF_TYPE *)CONCAT26(uVar23,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,m0_00,m1_00,in_RDI,in_stack_000002d0,in_stack_000002d8);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)(in_stack_00000010 << 1);
    in_RDI = (__m128i *)((long)*in_RDI + (ulong)in_ESI);
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw0_subh1_w16_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i zeros = _mm_setzero_si128();
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 16) {
      const __m128i m_i00 = xx_loadu_128(mask + j);
      const __m128i m_i10 = xx_loadu_128(mask + mask_stride + j);

      const __m128i m_ac = _mm_avg_epu8(_mm_adds_epu8(m_i00, m_i10), zeros);
      const __m128i m0 = _mm_cvtepu8_epi16(m_ac);
      const __m128i m1 = _mm_cvtepu8_epi16(_mm_srli_si128(m_ac, 8));

      blend_a64_d16_mask_w16_sse41(dst + j, src0 + j, src1 + j, &m0, &m1,
                                   round_offset, &v_maxval, shift);
    }
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}